

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

void miniros::serialization::
     Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
     write<miniros::serialization::OStream>(OStream *stream,StringType *str)

{
  void *__src;
  ulong *in_RDI;
  size_t len;
  uint8_t *old_data;
  uint *in_stack_ffffffffffffffa8;
  OStream *in_stack_ffffffffffffffb0;
  void *__dest;
  undefined4 local_44;
  ulong local_40;
  ulong *local_30;
  void *local_28;
  undefined4 local_1c;
  ulong *local_18;
  undefined4 *local_10;
  ulong *local_8;
  
  local_30 = in_RDI;
  local_40 = std::__cxx11::string::size();
  local_44 = (undefined4)local_40;
  local_8 = local_30;
  local_10 = &local_44;
  serialize<unsigned_int,miniros::serialization::OStream>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (local_40 != 0) {
    local_18 = local_30;
    local_1c = (undefined4)local_40;
    local_28 = (void *)*local_30;
    *local_30 = *local_30 + (local_40 & 0xffffffff);
    if (local_30[1] < *local_30) {
      throwStreamOverrun();
    }
    __dest = local_28;
    __src = (void *)std::__cxx11::string::data();
    memcpy(__dest,__src,local_40);
  }
  return;
}

Assistant:

inline static void write(Stream& stream, const StringType& str)
  {
    size_t len = str.size();
    stream.next(static_cast<uint32_t>(len));

    if (len > 0)
    {
      memcpy(stream.advance(static_cast<uint32_t>(len)), str.data(), len);
    }
  }